

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O1

void __thiscall
bssl::anon_unknown_0::TicketAEADMethodTest_Resume_Test::TestBody
          (TicketAEADMethodTest_Resume_Test *this)

{
  uint16_t version;
  uint retry_count;
  ssl_test_ticket_aead_failure_mode failure_mode;
  bool bVar1;
  internal iVar2;
  int iVar3;
  SSL_METHOD *method;
  SSL_METHOD *meth;
  ParamType *pPVar4;
  char *in_R9;
  pointer *__ptr;
  AssertionResult gtest_ar_;
  UniquePtr<SSL> client;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  UniquePtr<SSL_SESSION> session;
  UniquePtr<SSL> server;
  UniquePtr<SSL_CTX> client_ctx;
  UniquePtr<SSL_CTX> server_ctx;
  AssertHelper local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  AssertHelper local_78;
  _Head_base<0UL,_ssl_st_*,_false> local_70;
  undefined1 local_68 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_48;
  _Head_base<0UL,_ssl_st_*,_false> local_40;
  AssertHelper local_38;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_30;
  _Head_base<0UL,_ssl_ctx_st_*,_false> local_28;
  
  method = TLS_method();
  CreateContextWithTestCertificate((anon_unknown_0 *)&local_28,method);
  local_88.data_._0_1_ = (internal)(local_28._M_head_impl != (SSL_CTX *)0x0);
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_28._M_head_impl == (SSL_CTX *)0x0) {
    testing::Message::Message((Message *)&local_30);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_68,(internal *)&local_88,(AssertionResult *)"server_ctx","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1621,(char *)local_68._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._0_8_ != &local_58) {
      operator_delete((void *)local_68._0_8_,(ulong)(local_58._M_allocated_capacity + 1));
    }
    if ((SSL_CTX *)local_30._M_head_impl != (SSL_CTX *)0x0) {
      (**(code **)(*(long *)local_30._M_head_impl + 8))();
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_80,local_80);
    }
    goto LAB_001a4b85;
  }
  meth = (SSL_METHOD *)TLS_method();
  local_30._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)SSL_CTX_new(meth);
  local_88.data_._0_1_ = (internal)((SSL_CTX *)local_30._M_head_impl != (SSL_CTX *)0x0);
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((SSL_CTX *)local_30._M_head_impl == (SSL_CTX *)0x0) {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_68,(internal *)&local_88,(AssertionResult *)"client_ctx","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_40,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1623,(char *)local_68._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_40,(Message *)&local_70);
LAB_001a4b34:
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._0_8_ != &local_58) {
      operator_delete((void *)local_68._0_8_,(ulong)(local_58._M_allocated_capacity + 1));
    }
    if (local_70._M_head_impl != (SSL *)0x0) {
      (*(local_70._M_head_impl)->method->ssl_new)(local_70._M_head_impl);
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_80,local_80);
    }
  }
  else {
    pPVar4 = testing::
             WithParamInterface<std::tuple<unsigned_short,_unsigned_int,_bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
             ::GetParam();
    version = (pPVar4->
              super__Tuple_impl<0UL,_unsigned_short,_unsigned_int,_bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>
              ).super__Head_base<0UL,_unsigned_short,_false>._M_head_impl;
    pPVar4 = testing::
             WithParamInterface<std::tuple<unsigned_short,_unsigned_int,_bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
             ::GetParam();
    retry_count = (pPVar4->
                  super__Tuple_impl<0UL,_unsigned_short,_unsigned_int,_bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>
                  ).
                  super__Tuple_impl<1UL,_unsigned_int,_bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>
                  .super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
    pPVar4 = testing::
             WithParamInterface<std::tuple<unsigned_short,_unsigned_int,_bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
             ::GetParam();
    failure_mode = (pPVar4->
                   super__Tuple_impl<0UL,_unsigned_short,_unsigned_int,_bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>
                   ).
                   super__Tuple_impl<1UL,_unsigned_int,_bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>
                   .
                   super__Tuple_impl<2UL,_bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>
                   .
                   super__Head_base<2UL,_bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode,_false>
                   ._M_head_impl;
    iVar3 = SSL_CTX_set_min_proto_version((SSL_CTX *)local_30._M_head_impl,version);
    local_88.data_._0_1_ = (internal)(iVar3 != 0);
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar3 == 0) {
      testing::Message::Message((Message *)&local_70);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_68,(internal *)&local_88,
                 (AssertionResult *)"SSL_CTX_set_min_proto_version(client_ctx.get(), version)",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_40,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x162a,(char *)local_68._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_40,(Message *)&local_70);
      goto LAB_001a4b34;
    }
    iVar3 = SSL_CTX_set_max_proto_version((SSL_CTX *)local_30._M_head_impl,version);
    local_88.data_._0_1_ = (internal)(iVar3 != 0);
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar3 == 0) {
      testing::Message::Message((Message *)&local_70);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_68,(internal *)&local_88,
                 (AssertionResult *)"SSL_CTX_set_max_proto_version(client_ctx.get(), version)",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_40,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x162b,(char *)local_68._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_40,(Message *)&local_70);
      goto LAB_001a4b34;
    }
    iVar3 = SSL_CTX_set_min_proto_version(local_28._M_head_impl,version);
    local_88.data_._0_1_ = (internal)(iVar3 != 0);
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar3 == 0) {
      testing::Message::Message((Message *)&local_70);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_68,(internal *)&local_88,
                 (AssertionResult *)"SSL_CTX_set_min_proto_version(server_ctx.get(), version)",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_40,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x162c,(char *)local_68._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_40,(Message *)&local_70);
      goto LAB_001a4b34;
    }
    iVar3 = SSL_CTX_set_max_proto_version(local_28._M_head_impl,version);
    local_88.data_._0_1_ = (internal)(iVar3 != 0);
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar3 == 0) {
      testing::Message::Message((Message *)&local_70);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_68,(internal *)&local_88,
                 (AssertionResult *)"SSL_CTX_set_max_proto_version(server_ctx.get(), version)",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_40,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x162d,(char *)local_68._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_40,(Message *)&local_70);
      goto LAB_001a4b34;
    }
    SSL_CTX_set_session_cache_mode((SSL_CTX *)local_30._M_head_impl,3);
    SSL_CTX_set_session_cache_mode(local_28._M_head_impl,3);
    SSL_CTX_set_current_time_cb((SSL_CTX *)local_30._M_head_impl,FrozenTimeCallback);
    SSL_CTX_set_current_time_cb(local_28._M_head_impl,FrozenTimeCallback);
    SSL_CTX_sess_set_new_cb((SSL_CTX *)local_30._M_head_impl,SaveLastSession);
    SSL_CTX_set_ticket_aead_method
              (local_28._M_head_impl,
               (SSL_TICKET_AEAD_METHOD *)(anonymous_namespace)::kSSLTestTicketMethod);
    local_70._M_head_impl = (SSL *)0x0;
    local_40._M_head_impl = (SSL *)0x0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
                ((HasNewFatalFailureHelper *)local_68);
      bVar1 = testing::internal::AlwaysTrue();
      if (bVar1) {
        in_R9 = (char *)(ulong)failure_mode;
        ConnectClientAndServerWithTicketMethod
                  ((UniquePtr<SSL> *)&local_70,(UniquePtr<SSL> *)&local_40,
                   (SSL_CTX *)local_30._M_head_impl,local_28._M_head_impl,retry_count,failure_mode,
                   (SSL_SESSION *)0x0);
      }
      bVar1 = local_68[8];
      testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
                ((HasNewFatalFailureHelper *)local_68);
      if (bVar1 != false) goto LAB_001a4819;
      if (failure_mode - ssl_test_ticket_aead_open_soft_fail < 2) {
LAB_001a4baf:
        local_88.data_._0_1_ = (internal)(local_70._M_head_impl != (SSL *)0x0);
        local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if ((bool)local_88.data_._0_1_) goto LAB_001a4bc9;
        testing::Message::Message((Message *)&local_48);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_68,(internal *)&local_88,(AssertionResult *)0x35cbac,"false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_78,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x163f,(char *)local_68._0_8_);
        testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_48);
LAB_001a4fe4:
        testing::internal::AssertHelper::~AssertHelper(&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._0_8_ != &local_58) {
          operator_delete((void *)local_68._0_8_,(ulong)(local_58._M_allocated_capacity + 1));
        }
        if ((SSL_SESSION *)local_48._M_head_impl != (SSL_SESSION *)0x0) {
          (**(code **)(*(long *)local_48._M_head_impl + 8))();
        }
LAB_001a5019:
        if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_80,local_80);
        }
        goto LAB_001a486e;
      }
      if (failure_mode == ssl_test_ticket_aead_seal_fail) {
        local_88.data_._0_1_ = (internal)(local_70._M_head_impl == (SSL *)0x0);
        local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!(bool)local_88.data_._0_1_) {
          testing::Message::Message((Message *)&local_48);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_68,(internal *)&local_88,(AssertionResult *)0x35cbac,"true",
                     "false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_78,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x1642,(char *)local_68._0_8_);
          testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_48);
          goto LAB_001a4fe4;
        }
        goto LAB_001a5019;
      }
      if (failure_mode == ssl_test_ticket_aead_ok) goto LAB_001a4baf;
LAB_001a4bc9:
      iVar3 = SSL_session_reused(local_70._M_head_impl);
      local_88.data_._0_1_ = (internal)(iVar3 == 0);
      local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!(bool)local_88.data_._0_1_) {
        testing::Message::Message((Message *)&local_48);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_68,(internal *)&local_88,
                   (AssertionResult *)"SSL_session_reused(client.get())","true","false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_78,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x1645,(char *)local_68._0_8_);
        testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_48);
        testing::internal::AssertHelper::~AssertHelper(&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._0_8_ != &local_58) {
          operator_delete((void *)local_68._0_8_,(ulong)(local_58._M_allocated_capacity + 1));
        }
        if ((SSL_SESSION *)local_48._M_head_impl != (SSL_SESSION *)0x0) {
          (**(code **)(*(long *)local_48._M_head_impl + 8))();
        }
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
      iVar3 = SSL_session_reused(local_40._M_head_impl);
      local_88.data_._0_1_ = (internal)(iVar3 == 0);
      local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!(bool)local_88.data_._0_1_) {
        testing::Message::Message((Message *)&local_48);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_68,(internal *)&local_88,
                   (AssertionResult *)"SSL_session_reused(server.get())","true","false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_78,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x1646,(char *)local_68._0_8_);
        testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_48);
        testing::internal::AssertHelper::~AssertHelper(&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._0_8_ != &local_58) {
          operator_delete((void *)local_68._0_8_,(ulong)(local_58._M_allocated_capacity + 1));
        }
        if ((SSL_SESSION *)local_48._M_head_impl != (SSL_SESSION *)0x0) {
          (**(code **)(*(long *)local_48._M_head_impl + 8))();
        }
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
      iVar2 = (internal)FlushNewSessionTickets(local_70._M_head_impl,local_40._M_head_impl);
      local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_88.data_._0_1_ = iVar2;
      if (!(bool)iVar2) {
        testing::Message::Message((Message *)&local_48);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_68,(internal *)&local_88,
                   (AssertionResult *)"FlushNewSessionTickets(client.get(), server.get())","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_78,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x1648,(char *)local_68._0_8_);
        testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_48);
        testing::internal::AssertHelper::~AssertHelper(&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._0_8_ != &local_58) {
          operator_delete((void *)local_68._0_8_,(ulong)(local_58._M_allocated_capacity + 1));
        }
        if ((SSL_SESSION *)local_48._M_head_impl != (SSL_SESSION *)0x0) {
          (**(code **)(*(long *)local_48._M_head_impl + 8))();
        }
        if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_80,local_80);
        }
        if (!(bool)iVar2) goto LAB_001a486e;
      }
      local_48._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (anonymous_namespace)::g_last_session;
      (anonymous_namespace)::g_last_session = (SSL_SESSION *)0x0;
      bVar1 = testing::internal::AlwaysTrue();
      if (bVar1) {
        testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
                  ((HasNewFatalFailureHelper *)local_68);
        bVar1 = testing::internal::AlwaysTrue();
        if (bVar1) {
          in_R9 = (char *)(ulong)failure_mode;
          ConnectClientAndServerWithTicketMethod
                    ((UniquePtr<SSL> *)&local_70,(UniquePtr<SSL> *)&local_40,
                     (SSL_CTX *)local_30._M_head_impl,local_28._M_head_impl,retry_count,failure_mode
                     ,(SSL_SESSION *)local_48._M_head_impl);
        }
        testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
                  ((HasNewFatalFailureHelper *)local_68);
        if (local_68[8] != false) goto LAB_001a4ea2;
        switch(failure_mode) {
        case ssl_test_ticket_aead_ok:
          local_88.data_._0_1_ = (internal)(local_70._M_head_impl != (SSL *)0x0);
          local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (local_70._M_head_impl == (SSL *)0x0) {
            testing::Message::Message((Message *)&local_78);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_68,(internal *)&local_88,(AssertionResult *)0x35cbac,"false",
                       "true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_38,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x164f,(char *)local_68._0_8_);
            testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_78);
          }
          else {
            iVar3 = SSL_session_reused(local_70._M_head_impl);
            local_88.data_._0_1_ = (internal)(iVar3 != 0);
            local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (!(bool)local_88.data_._0_1_) {
              testing::Message::Message((Message *)&local_78);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_68,(internal *)&local_88,
                         (AssertionResult *)"SSL_session_reused(client.get())","false","true",in_R9)
              ;
              testing::internal::AssertHelper::AssertHelper
                        (&local_38,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x1650,(char *)local_68._0_8_);
              testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_78);
              testing::internal::AssertHelper::~AssertHelper(&local_38);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_68._0_8_ != &local_58) {
                operator_delete((void *)local_68._0_8_,(ulong)(local_58._M_allocated_capacity + 1));
              }
              if (local_78.data_ != (AssertHelperData *)0x0) {
                (**(code **)(*(long *)local_78.data_ + 8))();
              }
            }
            if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_80,local_80);
            }
            iVar3 = SSL_session_reused(local_40._M_head_impl);
            local_88.data_._0_1_ = (internal)(iVar3 != 0);
            local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if ((bool)local_88.data_._0_1_) goto LAB_001a5495;
            testing::Message::Message((Message *)&local_78);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_68,(internal *)&local_88,
                       (AssertionResult *)"SSL_session_reused(server.get())","false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_38,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x1651,(char *)local_68._0_8_);
            testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_78);
          }
          break;
        case ssl_test_ticket_aead_seal_fail:
          abort();
        case ssl_test_ticket_aead_open_soft_fail:
          local_88.data_._0_1_ = (internal)(local_70._M_head_impl != (SSL *)0x0);
          local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (local_70._M_head_impl == (SSL *)0x0) {
            testing::Message::Message((Message *)&local_78);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_68,(internal *)&local_88,(AssertionResult *)0x35cbac,"false",
                       "true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_38,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x165a,(char *)local_68._0_8_);
            testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_78);
          }
          else {
            iVar3 = SSL_session_reused(local_70._M_head_impl);
            local_88.data_._0_1_ = (internal)(iVar3 == 0);
            local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (!(bool)local_88.data_._0_1_) {
              testing::Message::Message((Message *)&local_78);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_68,(internal *)&local_88,
                         (AssertionResult *)"SSL_session_reused(client.get())","true","false",in_R9)
              ;
              testing::internal::AssertHelper::AssertHelper
                        (&local_38,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x165b,(char *)local_68._0_8_);
              testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_78);
              testing::internal::AssertHelper::~AssertHelper(&local_38);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_68._0_8_ != &local_58) {
                operator_delete((void *)local_68._0_8_,(ulong)(local_58._M_allocated_capacity + 1));
              }
              if (local_78.data_ != (AssertHelperData *)0x0) {
                (**(code **)(*(long *)local_78.data_ + 8))();
              }
            }
            if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_80,local_80);
            }
            iVar3 = SSL_session_reused(local_40._M_head_impl);
            local_88.data_._0_1_ = (internal)(iVar3 == 0);
            local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if ((bool)local_88.data_._0_1_) goto LAB_001a5495;
            testing::Message::Message((Message *)&local_78);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_68,(internal *)&local_88,
                       (AssertionResult *)"SSL_session_reused(server.get())","true","false",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_38,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x165c,(char *)local_68._0_8_);
            testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_78);
          }
          break;
        case ssl_test_ticket_aead_open_hard_fail:
          local_88.data_._0_1_ = (internal)(local_70._M_head_impl == (SSL *)0x0);
          local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (!(bool)local_88.data_._0_1_) {
            testing::Message::Message((Message *)&local_78);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_68,(internal *)&local_88,(AssertionResult *)0x35cbac,"true",
                       "false",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_38,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x1657,(char *)local_68._0_8_);
            testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_78);
            break;
          }
          goto LAB_001a5495;
        default:
          goto switchD_001a504d_default;
        }
        testing::internal::AssertHelper::~AssertHelper(&local_38);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._0_8_ != &local_58) {
          operator_delete((void *)local_68._0_8_,(ulong)(local_58._M_allocated_capacity + 1));
        }
        if (local_78.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_78.data_ + 8))();
        }
LAB_001a5495:
        if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_80,local_80);
        }
      }
      else {
LAB_001a4ea2:
        testing::Message::Message((Message *)local_68);
        testing::internal::AssertHelper::AssertHelper
                  (&local_88,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x164c,
                   "Expected: ConnectClientAndServerWithTicketMethod( &client, &server, client_ctx.get(), server_ctx.get(), retry_count, failure_mode, session.get()) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
                  );
        testing::internal::AssertHelper::operator=(&local_88,(Message *)local_68);
        testing::internal::AssertHelper::~AssertHelper(&local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*(_func_int **)local_68._0_8_ + 8))();
        }
      }
switchD_001a504d_default:
      std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)&local_48);
    }
    else {
LAB_001a4819:
      testing::Message::Message((Message *)local_68);
      testing::internal::AssertHelper::AssertHelper
                (&local_88,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x163a,
                 "Expected: ConnectClientAndServerWithTicketMethod( &client, &server, client_ctx.get(), server_ctx.get(), retry_count, failure_mode, nullptr) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
                );
      testing::internal::AssertHelper::operator=(&local_88,(Message *)local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(_func_int **)local_68._0_8_ + 8))();
      }
    }
LAB_001a486e:
    std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)&local_40);
    std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)&local_70);
  }
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&local_30);
LAB_001a4b85:
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&local_28);
  return;
}

Assistant:

TEST_P(TicketAEADMethodTest, Resume) {
  bssl::UniquePtr<SSL_CTX> server_ctx =
      CreateContextWithTestCertificate(TLS_method());
  ASSERT_TRUE(server_ctx);
  bssl::UniquePtr<SSL_CTX> client_ctx(SSL_CTX_new(TLS_method()));
  ASSERT_TRUE(client_ctx);

  const uint16_t version = testing::get<0>(GetParam());
  const unsigned retry_count = testing::get<1>(GetParam());
  const ssl_test_ticket_aead_failure_mode failure_mode =
      testing::get<2>(GetParam());

  ASSERT_TRUE(SSL_CTX_set_min_proto_version(client_ctx.get(), version));
  ASSERT_TRUE(SSL_CTX_set_max_proto_version(client_ctx.get(), version));
  ASSERT_TRUE(SSL_CTX_set_min_proto_version(server_ctx.get(), version));
  ASSERT_TRUE(SSL_CTX_set_max_proto_version(server_ctx.get(), version));

  SSL_CTX_set_session_cache_mode(client_ctx.get(), SSL_SESS_CACHE_BOTH);
  SSL_CTX_set_session_cache_mode(server_ctx.get(), SSL_SESS_CACHE_BOTH);
  SSL_CTX_set_current_time_cb(client_ctx.get(), FrozenTimeCallback);
  SSL_CTX_set_current_time_cb(server_ctx.get(), FrozenTimeCallback);
  SSL_CTX_sess_set_new_cb(client_ctx.get(), SaveLastSession);

  SSL_CTX_set_ticket_aead_method(server_ctx.get(), &kSSLTestTicketMethod);

  bssl::UniquePtr<SSL> client, server;
  ASSERT_NO_FATAL_FAILURE(ConnectClientAndServerWithTicketMethod(
      &client, &server, client_ctx.get(), server_ctx.get(), retry_count,
      failure_mode, nullptr));
  switch (failure_mode) {
    case ssl_test_ticket_aead_ok:
    case ssl_test_ticket_aead_open_hard_fail:
    case ssl_test_ticket_aead_open_soft_fail:
      ASSERT_TRUE(client);
      break;
    case ssl_test_ticket_aead_seal_fail:
      EXPECT_FALSE(client);
      return;
  }
  EXPECT_FALSE(SSL_session_reused(client.get()));
  EXPECT_FALSE(SSL_session_reused(server.get()));

  ASSERT_TRUE(FlushNewSessionTickets(client.get(), server.get()));
  bssl::UniquePtr<SSL_SESSION> session = std::move(g_last_session);
  ASSERT_NO_FATAL_FAILURE(ConnectClientAndServerWithTicketMethod(
      &client, &server, client_ctx.get(), server_ctx.get(), retry_count,
      failure_mode, session.get()));
  switch (failure_mode) {
    case ssl_test_ticket_aead_ok:
      ASSERT_TRUE(client);
      EXPECT_TRUE(SSL_session_reused(client.get()));
      EXPECT_TRUE(SSL_session_reused(server.get()));
      break;
    case ssl_test_ticket_aead_seal_fail:
      abort();
      break;
    case ssl_test_ticket_aead_open_hard_fail:
      EXPECT_FALSE(client);
      break;
    case ssl_test_ticket_aead_open_soft_fail:
      ASSERT_TRUE(client);
      EXPECT_FALSE(SSL_session_reused(client.get()));
      EXPECT_FALSE(SSL_session_reused(server.get()));
  }
}